

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

int Acb_CheckMiter(Cnf_Dat_t *pCnf)

{
  int iVar1;
  sat_solver *s;
  long lVar2;
  int Lit;
  
  s = sat_solver_new();
  sat_solver_setnvars(s,pCnf->nVars);
  lVar2 = 0;
  do {
    if (pCnf->nClauses <= lVar2) {
      Lit = 2;
      iVar1 = sat_solver_addclause(s,&Lit,(lit *)&stack0xffffffffffffffe0);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      sat_solver_delete(s);
      return (uint)(iVar1 == -1);
    }
    iVar1 = sat_solver_addclause(s,pCnf->pClauses[lVar2],pCnf->pClauses[lVar2 + 1]);
    lVar2 = lVar2 + 1;
  } while (iVar1 != 0);
  return 1;
}

Assistant:

int Acb_CheckMiter( Cnf_Dat_t * pCnf )
{
    int iCoVarBeg = 1, i, Lit, status;
    sat_solver * pSat = sat_solver_new(); 
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return 1;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return 1;
    status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
    sat_solver_delete( pSat );
    return status == l_False;
}